

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

word If_Dec6Truth(word z)

{
  uint uVar1;
  word wVar2;
  long lVar3;
  uint uVar4;
  word wVar5;
  char *__assertion;
  word awStack_98 [8];
  word awStack_58 [4];
  word f [4];
  
  if (z == 0) {
    __assertion = "z";
    uVar1 = 0x7a;
LAB_00376866:
    awStack_58[3] = 0x37686c;
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,uVar1,"word If_Dec6Truth(word)");
  }
  lVar3 = 0x10;
  do {
    if (lVar3 == 0x20) {
      awStack_58[3] = 0x376805;
      wVar2 = If_Dec6ComposeLut4((uint)z & 0xffff,f);
      for (lVar3 = 0x30; lVar3 != 0x40; lVar3 = lVar3 + 4) {
        uVar1 = (uint)(z >> ((byte)lVar3 & 0x3f));
        uVar4 = uVar1 & 7;
        if (uVar4 != 6) {
          wVar5 = wVar2;
          if (uVar4 != 7) {
            wVar5 = Truth6[uVar1 & 7];
          }
          *(word *)((long)awStack_98 + lVar3 * 2) = wVar5;
        }
      }
      awStack_58[3] = 0x376847;
      wVar2 = If_Dec6ComposeLut4((uint)(z >> 0x20) & 0xffff,f);
      return wVar2;
    }
    uVar1 = (uint)(z >> ((byte)lVar3 & 0x3f));
    uVar4 = uVar1 & 7;
    if (uVar4 != 6) {
      if (uVar4 == 7) {
        __assertion = "v != 7";
        uVar1 = 0x7e;
        goto LAB_00376866;
      }
      *(word *)((long)awStack_58 + lVar3 * 2) = Truth6[uVar1 & 7];
    }
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

word If_Dec6Truth( word z )
{
    word r, q, f[4];
    int i, v;
    assert( z );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (16+(i<<2))) & 7;
        assert( v != 7 );
        if ( v == 6 )
            continue;
        f[i] = Truth6[v];
    }
    q = If_Dec6ComposeLut4( (int)(z & 0xffff), f );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (48+(i<<2))) & 7;
        if ( v == 6 )
            continue;
        f[i] = (v == 7) ? q : Truth6[v];
    }
    r = If_Dec6ComposeLut4( (int)((z >> 32) & 0xffff), f );
    return r;
}